

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_message.hpp
# Opt level: O2

void __thiscall
iutest::detail::iuStreamMessage::iuStreamMessage(iuStreamMessage *this,iuStreamMessage *rhs)

{
  string local_30;
  
  std::__cxx11::stringbuf::str();
  iu_global_format_stringstream::iu_global_format_stringstream(&this->m_stream,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

iuStreamMessage(const iuStreamMessage& rhs) : m_stream(rhs.GetString()) {}